

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTBoard.cpp
# Opt level: O0

char __thiscall TTTBoard::PrintCell(TTTBoard *this,CellType cell)

{
  undefined1 local_15;
  char cellchar;
  CellType cell_local;
  TTTBoard *this_local;
  
  local_15 = ' ';
  if (cell == EXXES) {
    local_15 = 'X';
  }
  else if (cell == OHS) {
    local_15 = 'O';
  }
  return local_15;
}

Assistant:

char TTTBoard::PrintCell(CellType cell) const
{
    char cellchar = ' ';

    if(cell == EXXES)
        cellchar = 'X';
    else if (cell == OHS)
        cellchar = 'O';

    return cellchar;
}